

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O3

void __thiscall Face::print(Face *this)

{
  Color CVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int layer;
  int entry;
  int iVar5;
  
  CVar1 = this->center_color;
  layer = 0;
  iVar3 = 3;
  iVar4 = 1;
  do {
    iVar2 = iVar3 + (uint)(iVar3 == 0);
    iVar5 = iVar2;
    if (layer != 3) {
      do {
        putchar(0x20);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    iVar5 = 0;
    do {
      print_triangle(this,(uint)(CVar1 == green) * 3,layer,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar4 != iVar5);
    if (layer != 3) {
      do {
        putchar(0x20);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    putchar(10);
    layer = layer + 1;
    iVar3 = iVar3 + -1;
    iVar4 = iVar4 + 2;
  } while (layer != 4);
  return;
}

Assistant:

void Face::print(){
    Corner ref_corner;
    if(center_color == Color::green){
        ref_corner = Corner::B;
    }
    else{
        ref_corner = Corner::U;
    }
    for(int layer = 0; layer < 4; layer++){
        int row_len = 2*layer + 1;
        for(int j = 0; j < (7-row_len)/2; j++){
            printf(" ");
        }
        for(int entry = 0; entry < row_len; entry++){
            print_triangle(ref_corner, layer, entry);
        }
        for(int j = 0; j < (7-row_len)/2; j++){
            printf(" ");
        }
        printf("\n");
    }
}